

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interface_ProblemToPolicyDiscretePure.h
# Opt level: O1

LIndex __thiscall
Interface_ProblemToPolicyDiscretePure::GetNrJointPolicies
          (Interface_ProblemToPolicyDiscretePure *this,PolicyDomainCategory cat,size_t depth)

{
  long lVar1;
  LIndex LVar2;
  ulong uVar3;
  EOverflow *this_00;
  ulong uVar4;
  ulong uVar5;
  
  lVar1 = (**(code **)(*(long *)this + 0x18))();
  if (lVar1 == 0) {
    LVar2 = 1;
  }
  else {
    uVar5 = 0;
    uVar4 = 1;
    do {
      LVar2 = GetNrPolicies(this,(Index)uVar5,cat,depth);
      LVar2 = LVar2 * uVar4;
      if (LVar2 < uVar4) {
        this_00 = (EOverflow *)__cxa_allocate_exception(0x28);
        EOverflow::EOverflow
                  (this_00,
                   "Interface_ProblemToPolicyDiscretePure::GetNrJointPolicies() overflow detected");
        __cxa_throw(this_00,&EOverflow::typeinfo,E::~E);
      }
      uVar5 = (ulong)((Index)uVar5 + 1);
      uVar3 = (**(code **)(*(long *)this + 0x18))(this);
      uVar4 = LVar2;
    } while (uVar5 < uVar3);
  }
  return LVar2;
}

Assistant:

LIndex GetNrJointPolicies(PolicyGlobals::PolicyDomainCategory cat, 
                                  size_t depth=MAXHORIZON) const
        {
            LIndex n=1;
            for(Index ag=0; ag < GetNrAgents(); ag++)
            {
                LIndex nOld=n;
                n *= GetNrPolicies(ag,cat,depth);
                if(n<nOld)
                    throw(EOverflow("Interface_ProblemToPolicyDiscretePure::GetNrJointPolicies() overflow detected"));
            }

            return(n);
        }